

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersenne_twister.hpp
# Opt level: O2

void __thiscall
boost::random::
mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
::normalize_state(mersenne_twister_engine<unsigned_int,_32UL,_624UL,_397UL,_31UL,_2567483615U,_11UL,_4294967295U,_7UL,_2636928640U,_15UL,_4022730752U,_18UL,_1812433253U>
                  *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  size_t j;
  long lVar5;
  
  uVar4 = this->x[0x26f] ^ this->x[0x18c];
  uVar3 = uVar4 * 2;
  uVar2 = uVar3 ^ 0x321161bf;
  if (-1 < (int)uVar4) {
    uVar2 = uVar3;
  }
  this->x[0] = uVar2 & 0x7fffffff | this->x[0] & 0x80000000;
  lVar5 = 0;
  do {
    if (lVar5 == 0x270) {
      this->x[0] = 0x80000000;
      return;
    }
    puVar1 = this->x + lVar5;
    lVar5 = lVar5 + 1;
  } while (*puVar1 == 0);
  return;
}

Assistant:

void normalize_state()
    {
        const UIntType upper_mask = (~static_cast<UIntType>(0)) << r;
        const UIntType lower_mask = ~upper_mask;
        UIntType y0 = x[m-1] ^ x[n-1];
        if(y0 & (static_cast<UIntType>(1) << (w-1))) {
            y0 = ((y0 ^ a) << 1) | 1;
        } else {
            y0 = y0 << 1;
        }
        x[0] = (x[0] & upper_mask) | (y0 & lower_mask);

        // fix up the state if it's all zeroes.
        for(std::size_t j = 0; j < n; ++j) {
            if(x[j] != 0) return;
        }
        x[0] = static_cast<UIntType>(1) << (w-1);
    }